

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O0

shared_ptr<kratos::Param> __thiscall kratos::Var::as<kratos::Param>(Var *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Param> sVar1;
  enable_shared_from_this<kratos::Var> local_28;
  Var *this_local;
  
  this_local = this;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_28);
  std::static_pointer_cast<kratos::Param,kratos::Var>((shared_ptr<kratos::Var> *)this);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_28);
  sVar1.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Param>)
         sVar1.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as() {
        return std::static_pointer_cast<T>(shared_from_this());
    }